

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O3

CopyablePtr<perfetto::protos::gen::DataSourceDescriptor> * __thiscall
protozero::CopyablePtr<perfetto::protos::gen::DataSourceDescriptor>::operator=
          (CopyablePtr<perfetto::protos::gen::DataSourceDescriptor> *this,
          CopyablePtr<perfetto::protos::gen::DataSourceDescriptor> *other)

{
  _Head_base<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_false> _Var1;
  _Head_base<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_false> _Var2;
  
  _Var1._M_head_impl =
       (other->ptr_)._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::DataSourceDescriptor,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
       .super__Head_base<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_false>._M_head_impl;
  (other->ptr_)._M_t.
  super___uniq_ptr_impl<perfetto::protos::gen::DataSourceDescriptor,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
  .super__Head_base<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_false>._M_head_impl =
       (DataSourceDescriptor *)0x0;
  _Var2._M_head_impl =
       (this->ptr_)._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::DataSourceDescriptor,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
       .super__Head_base<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_false>._M_head_impl;
  (this->ptr_)._M_t.
  super___uniq_ptr_impl<perfetto::protos::gen::DataSourceDescriptor,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
  .super__Head_base<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_false>._M_head_impl =
       _Var1._M_head_impl;
  if (_Var2._M_head_impl != (DataSourceDescriptor *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_CppMessageObj + 8))();
  }
  _Var2._M_head_impl = (DataSourceDescriptor *)operator_new(0xc0);
  perfetto::protos::gen::DataSourceDescriptor::DataSourceDescriptor(_Var2._M_head_impl);
  _Var1._M_head_impl =
       (other->ptr_)._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::DataSourceDescriptor,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
       .super__Head_base<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_false>._M_head_impl;
  (other->ptr_)._M_t.
  super___uniq_ptr_impl<perfetto::protos::gen::DataSourceDescriptor,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
  .super__Head_base<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_false>._M_head_impl =
       _Var2._M_head_impl;
  if (_Var1._M_head_impl != (DataSourceDescriptor *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_CppMessageObj + 8))();
  }
  return this;
}

Assistant:

CopyablePtr& operator=(CopyablePtr&& other) {
    ptr_ = std::move(other.ptr_);
    other.ptr_.reset(new T());
    return *this;
  }